

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeSetJacTimes(void *arkode_mem,ARKLsJacTimesSetupFn jtsetup,ARKLsJacTimesVecFn jtimes)

{
  long lVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x385;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar3 = -0x30;
    error_code = -0x30;
    line = 0x38e;
  }
  else {
    lVar1 = (**(code **)((long)arkode_mem + 0x140))(arkode_mem);
    if (lVar1 == 0) {
      arkProcessError((ARKodeMem)arkode_mem,-2,0xff8,"ARKodeSetJacTimes",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Linear solver memory is NULL.");
      return -2;
    }
    if (*(long *)(*(long *)(*(long *)(lVar1 + 0x38) + 8) + 0x10) == 0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied ATimes routine";
      iVar3 = -3;
      error_code = -3;
      line = 0x39a;
    }
    else {
      if (jtimes != (ARKLsJacTimesVecFn)0x0) {
        *(undefined4 *)(lVar1 + 0xf0) = 0;
        *(ARKLsJacTimesSetupFn *)(lVar1 + 0xf8) = jtsetup;
        *(ARKLsJacTimesVecFn *)(lVar1 + 0x100) = jtimes;
        *(undefined8 *)(lVar1 + 0x110) = *(undefined8 *)((long)arkode_mem + 0x10);
        return 0;
      }
      *(undefined4 *)(lVar1 + 0xf0) = 1;
      *(undefined8 *)(lVar1 + 0xf8) = 0;
      *(code **)(lVar1 + 0x100) = arkLsDQJtimes;
      *(void **)(lVar1 + 0x110) = arkode_mem;
      lVar2 = (**(code **)((long)arkode_mem + 0x148))(arkode_mem);
      *(long *)(lVar1 + 0x108) = lVar2;
      if (lVar2 != 0) {
        return 0;
      }
      msgfmt = "Time step module is missing implicit RHS fcn";
      iVar3 = -3;
      error_code = -3;
      line = 0x3b2;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetJacTimes",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int ARKodeSetJacTimes(void* arkode_mem, ARKLsJacTimesSetupFn jtsetup,
                      ARKLsJacTimesVecFn jtimes)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    arkls_mem->jtimesDQ = SUNFALSE;
    arkls_mem->jtsetup  = jtsetup;
    arkls_mem->jtimes   = jtimes;
    arkls_mem->Jt_data  = ark_mem->user_data;
  }
  else
  {
    arkls_mem->jtimesDQ = SUNTRUE;
    arkls_mem->jtsetup  = NULL;
    arkls_mem->jtimes   = arkLsDQJtimes;
    arkls_mem->Jt_data  = ark_mem;
    arkls_mem->Jt_f     = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}